

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprListDelete(sqlite3 *db,ExprList *pList)

{
  int *in_RSI;
  ExprList_item *pItem;
  int i;
  Expr *in_stack_ffffffffffffffd8;
  sqlite3 *db_00;
  int local_14;
  
  if (in_RSI != (int *)0x0) {
    db_00 = *(sqlite3 **)(in_RSI + 2);
    for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
      sqlite3ExprDelete(db_00,in_stack_ffffffffffffffd8);
      sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
      sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
      db_00 = (sqlite3 *)&db_00->aDb;
    }
    sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
    sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListDelete(sqlite3 *db, ExprList *pList){
  int i;
  struct ExprList_item *pItem;
  if( pList==0 ) return;
  assert( pList->a!=0 || pList->nExpr==0 );
  for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
    sqlite3ExprDelete(db, pItem->pExpr);
    sqlite3DbFree(db, pItem->zName);
    sqlite3DbFree(db, pItem->zSpan);
  }
  sqlite3DbFree(db, pList->a);
  sqlite3DbFree(db, pList);
}